

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimedExecution.h
# Opt level: O0

void nrg::TimedExecution::push<void(*)(int,std::__cxx11::string_const&),int&,char_const(&)[7]>
               (Queue *queue,
               _func_void_int_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
               *fn,int *param,char (*param_4) [7])

{
  long local_a8;
  QueueElement local_90;
  anon_class_24_3_7e084ec6 local_68;
  undefined1 local_50 [8];
  QueueElement elem;
  char (*param_local_1) [7];
  int *param_local;
  _func_void_int_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *fn_local;
  Queue *queue_local;
  
  elem.what._M_invoker = (_Invoker_type)param_4;
  local_50 = (undefined1  [8])now();
  local_68.param = *param;
  local_a8 = 0;
  do {
    local_50[local_a8 + -0xc] = elem.what._M_invoker[local_a8];
    local_a8 = local_a8 + 1;
  } while (local_a8 != 7);
  local_68.fn = fn;
  std::function<void()>::
  function<nrg::TimedExecution::push<void(*)(int,std::__cxx11::string_const&),int&,char_const(&)[7]>(std::priority_queue<nrg::TimedExecution::QueueElement,std::vector<nrg::TimedExecution::QueueElement,std::allocator<nrg::TimedExecution::QueueElement>>,std::greater<nrg::TimedExecution::QueueElement>>&,void(*)(int,std::__cxx11::string_const&),int&,char_const(&)[7])::_lambda()_1_,void>
            ((function<void()> *)&elem,&local_68);
  QueueElement::QueueElement(&local_90,(QueueElement *)local_50);
  push(queue,&local_90);
  QueueElement::~QueueElement(&local_90);
  QueueElement::~QueueElement((QueueElement *)local_50);
  return;
}

Assistant:

static void push(Queue& queue, FN fn, Param&&... param)
    {
        QueueElement elem = { now(), [=]() { fn(param...); } };
        push(queue, std::move(elem));
    }